

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool pugi::impl::anon_unknown_0::allow_move(xml_node parent,xml_node child)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  
  uVar1 = 0;
  uVar3 = 0;
  if (parent._root != (xml_node_struct *)0x0) {
    uVar3 = (uint)(parent._root)->header & 0xf;
  }
  if (child._root != (xml_node_struct *)0x0) {
    uVar1 = (uint)(child._root)->header & 0xf;
  }
  if ((1 < uVar1 && 0xfffffffd < uVar3 - 3) && ((uVar3 == 1 || (uVar1 - 9 < 0xfffffffe)))) {
    if (parent._root == (xml_node_struct *)0x0) {
      lVar2 = 0;
    }
    else {
      lVar2 = *(long *)((long)parent._root - ((parent._root)->header >> 8)) + -0x40;
    }
    if (child._root == (xml_node_struct *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = *(long *)((long)child._root - ((child._root)->header >> 8)) + -0x40;
    }
    if (lVar2 == lVar4) {
      if (parent._root == child._root || parent._root == (xml_node_struct *)0x0) {
        return parent._root == (xml_node_struct *)0x0;
      }
      do {
        parent._root = (parent._root)->parent;
        bVar5 = parent._root == (xml_node_struct *)0x0;
        if (bVar5) {
          return bVar5;
        }
      } while (parent._root != child._root);
      return bVar5;
    }
  }
  return false;
}

Assistant:

PUGI__FN bool allow_move(xml_node parent, xml_node child)
	{
		// check that child can be a child of parent
		if (!allow_insert_child(parent.type(), child.type()))
			return false;

		// check that node is not moved between documents
		if (parent.root() != child.root())
			return false;

		// check that new parent is not in the child subtree
		xml_node cur = parent;

		while (cur)
		{
			if (cur == child)
				return false;

			cur = cur.parent();
		}

		return true;
	}